

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fuzz.c
# Opt level: O1

void test_fuzz(files *filesets)

{
  char *__size;
  bool bVar1;
  bool bVar2;
  files *pfVar3;
  int iVar4;
  wchar_t wVar5;
  int iVar6;
  int iVar7;
  archive *paVar8;
  char *__src;
  void *__ptr;
  void *__dest;
  time_t tVar9;
  FILE *__s;
  size_t v2;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  char *pcVar13;
  char **names;
  char *pcVar14;
  char ***pppcVar15;
  size_t size;
  archive_entry *ae;
  int64_t blk_offset;
  size_t blk_size;
  void *blk;
  char *local_70;
  char ***local_68;
  archive_entry *local_60;
  files *local_58;
  long local_50;
  int64_t local_48;
  size_t local_40;
  void *local_38;
  
  names = filesets->names;
  if (names != (char **)0x0) {
    pppcVar15 = &filesets->names;
    lVar12 = 0;
    local_58 = filesets;
    do {
      pfVar3 = local_58;
      local_70 = (char *)0x0;
      local_50 = lVar12;
      extract_reference_files(names);
      if (pfVar3[lVar12].uncompress == 0) {
        pcVar13 = **pppcVar15;
        if (pcVar13 == (char *)0x0) {
          __ptr = (void *)0x0;
        }
        else {
          lVar12 = 8;
          __ptr = (void *)0x0;
          pcVar14 = (char *)0x0;
          local_68 = pppcVar15;
          do {
            __src = slurpfile((size_t *)&local_70,pcVar13);
            pcVar13 = local_70;
            __size = pcVar14 + (long)local_70;
            __ptr = realloc(__ptr,(size_t)__size);
            memcpy(pcVar14 + (long)__ptr,__src,(size_t)pcVar13);
            local_70 = __size;
            free(__src);
            assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                             ,L'v',(uint)(__ptr != (void *)0x0),"rawimage != NULL",(void *)0x0);
            pcVar13 = *(char **)((long)*local_68 + lVar12);
            lVar12 = lVar12 + 8;
            pcVar14 = __size;
          } while (pcVar13 != (char *)0x0);
        }
LAB_001439cf:
        if (local_70 == (char *)0x0) {
          bVar2 = false;
        }
        else {
          __dest = malloc((size_t)local_70);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'}',(uint)(__dest != (void *)0x0),"image != NULL",(void *)0x0);
          if (__dest == (void *)0x0) {
            bVar2 = true;
          }
          else {
            iVar4 = 0;
            tVar9 = time((time_t *)0x0);
            srand((uint)tVar9);
            do {
              pcVar13 = local_70;
              memcpy(__dest,__ptr,(size_t)local_70);
              iVar7 = (int)pcVar13 / 100;
              if ((int)pcVar13 + 99U < 199) {
                iVar7 = 1;
              }
              iVar6 = rand();
              if (0 < (int)((long)iVar6 % (long)iVar7)) {
                uVar11 = (long)iVar6 % (long)iVar7 & 0xffffffff;
                do {
                  iVar7 = rand();
                  iVar6 = rand();
                  *(char *)((long)__dest + (ulong)(long)iVar6 % (ulong)local_70) = (char)iVar7;
                  uVar10 = (int)uVar11 - 1;
                  uVar11 = (ulong)uVar10;
                } while (uVar10 != 0);
              }
              iVar7 = 3;
              do {
                __s = fopen("after.test.failure.send.this.file.to.libarchive.maintainers.with.system.details"
                            ,"wb");
                pcVar13 = local_70;
                if (__s != (FILE *)0x0) goto LAB_00143aae;
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
              __s = (FILE *)0x0;
LAB_00143aae:
              v2 = fwrite(__dest,1,(size_t)local_70,__s);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                                  ,L'\x9e',(longlong)pcVar13,"(size_t)size",v2,
                                  "fwrite(image, 1, (size_t)size, f)",(void *)0x0);
              fclose(__s);
              paVar8 = archive_read_new();
              assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                               ,L'¡',(uint)(paVar8 != (archive *)0x0),
                               "(a = archive_read_new()) != NULL",(void *)0x0);
              iVar7 = archive_read_support_filter_all(paVar8);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                                  ,L'£',0,"ARCHIVE_OK",(long)iVar7,
                                  "archive_read_support_filter_all(a)",paVar8);
              iVar7 = archive_read_support_format_all(paVar8);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                                  ,L'¥',0,"ARCHIVE_OK",(long)iVar7,
                                  "archive_read_support_format_all(a)",paVar8);
              iVar7 = archive_read_open_memory(paVar8,__dest,(size_t)local_70);
              if (iVar7 == 0) {
                while (iVar7 = archive_read_next_header(paVar8,&local_60), iVar7 == 0) {
                  do {
                    iVar7 = archive_read_data_block(paVar8,&local_38,&local_40,&local_48);
                  } while (iVar7 == 0);
                }
                archive_read_close(paVar8);
              }
              archive_read_free(paVar8);
              iVar4 = iVar4 + 1;
            } while (iVar4 != 100);
            free(__dest);
            free(__ptr);
            bVar2 = false;
          }
        }
      }
      else {
        paVar8 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                         ,L'J',(uint)(paVar8 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                         (void *)0x0);
        iVar4 = archive_read_support_filter_all(paVar8);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                            ,L'L',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_filter_all(a)",
                            paVar8);
        iVar4 = archive_read_support_format_raw(paVar8);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                            ,L'N',0,"ARCHIVE_OK",(long)iVar4,"archive_read_support_format_raw(a)",
                            paVar8);
        wVar5 = archive_read_open_filenames(paVar8,*pppcVar15,0x4000);
        if (wVar5 == L'\0') {
          iVar4 = archive_read_next_header(paVar8,&local_60);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'Z',0,"ARCHIVE_OK",(long)iVar4,"archive_read_next_header(a, &ae)",
                              paVar8);
          __ptr = malloc(30000000);
          local_68 = pppcVar15;
          local_70 = (char *)archive_read_data(paVar8,__ptr,30000000);
          iVar4 = archive_read_next_header(paVar8,&local_60);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'^',1,"ARCHIVE_EOF",(long)iVar4,"archive_read_next_header(a, &ae)",
                              paVar8);
          iVar4 = archive_read_free(paVar8);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                              ,L'`',0,"ARCHIVE_OK",(long)iVar4,"archive_read_free(a)",(void *)0x0);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'a',(uint)(local_70 != (char *)0x0),"size > 0",(void *)0x0);
          if ((**local_68 == (char *)0x0) || ((*local_68)[1] == (char *)0x0)) {
            failure("Internal buffer is not big enough for uncompressed test files");
          }
          else {
            failure("Internal buffer is not big enough for uncompressed test file: %s");
          }
          wVar5 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                                   ,L'i',(uint)(local_70 < buff3 + 0x5e2810),"size < buffsize",
                                   (void *)0x0);
          bVar1 = true;
          if (wVar5 == L'\0') {
            free(__ptr);
            goto LAB_001439bc;
          }
        }
        else {
          archive_read_free(paVar8);
          if ((**pppcVar15 == (char *)0x0) || ((*pppcVar15)[1] == (char *)0x0)) {
            skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'S');
            __ptr = (void *)0x0;
            test_skipping("Cannot uncompress fileset");
          }
          else {
            skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_fuzz.c"
                           ,L'U');
            __ptr = (void *)0x0;
            test_skipping("Cannot uncompress %s",**pppcVar15);
          }
LAB_001439bc:
          bVar1 = false;
        }
        bVar2 = false;
        if (bVar1) goto LAB_001439cf;
      }
      if (bVar2) {
        return;
      }
      lVar12 = local_50 + 1;
      pppcVar15 = &local_58[lVar12].names;
      names = *pppcVar15;
    } while (names != (char **)0x0);
  }
  return;
}

Assistant:

static void
test_fuzz(const struct files *filesets)
{
	const void *blk;
	size_t blk_size;
	int64_t blk_offset;
	int n;

	for (n = 0; filesets[n].names != NULL; ++n) {
		const size_t buffsize = 30000000;
		struct archive_entry *ae;
		struct archive *a;
		char *rawimage = NULL, *image = NULL, *tmp = NULL;
		size_t size = 0, oldsize = 0;
		int i, q;

		extract_reference_files(filesets[n].names);
		if (filesets[n].uncompress) {
			int r;
			/* Use format_raw to decompress the data. */
			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_raw(a));
			r = archive_read_open_filenames(a, filesets[n].names, 16384);
			if (r != ARCHIVE_OK) {
				archive_read_free(a);
				if (filesets[n].names[0] == NULL || filesets[n].names[1] == NULL) {
					skipping("Cannot uncompress fileset");
				} else {
					skipping("Cannot uncompress %s", filesets[n].names[0]);
				}
				continue;
			}
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_next_header(a, &ae));
			rawimage = malloc(buffsize);
			size = archive_read_data(a, rawimage, buffsize);
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_next_header(a, &ae));
			assertEqualInt(ARCHIVE_OK,
			    archive_read_free(a));
			assert(size > 0);
			if (filesets[n].names[0] == NULL || filesets[n].names[1] == NULL) {
				failure("Internal buffer is not big enough for "
					"uncompressed test files");
			} else {
				failure("Internal buffer is not big enough for "
					"uncompressed test file: %s", filesets[n].names[0]);
			}
			if (!assert(size < buffsize)) {
				free(rawimage);
				continue;
			}
		} else {
			for (i = 0; filesets[n].names[i] != NULL; ++i)
			{
				tmp = slurpfile(&size, filesets[n].names[i]);
				rawimage = (char *)realloc(rawimage, oldsize + size);
				memcpy(rawimage + oldsize, tmp, size);
				oldsize += size;
				size = oldsize;
				free(tmp);
				if (!assert(rawimage != NULL))
					continue;
			}
		}
		if (size == 0)
			continue;
		image = malloc(size);
		assert(image != NULL);
		if (image == NULL)
			return;
		srand((unsigned)time(NULL));

		for (i = 0; i < 100; ++i) {
			FILE *f;
			int j, numbytes, trycnt;

			/* Fuzz < 1% of the bytes in the archive. */
			memcpy(image, rawimage, size);
			q = (int)size / 100;
			if (!q) q = 1;
			numbytes = (int)(rand() % q);
			for (j = 0; j < numbytes; ++j)
				image[rand() % size] = (char)rand();

			/* Save the messed-up image to a file.
			 * If we crash, that file will be useful. */
			for (trycnt = 0; trycnt < 3; trycnt++) {
				f = fopen("after.test.failure.send.this.file."
				    "to.libarchive.maintainers.with.system.details", "wb");
				if (f != NULL)
					break;
#if defined(_WIN32) && !defined(__CYGWIN__)
				/*
				 * Sometimes previous close operation does not completely
				 * end at this time. So we should take a wait while
				 * the operation running.
				 */
				Sleep(100);
#endif
			}
			assertEqualInt((size_t)size, fwrite(image, 1, (size_t)size, f));
			fclose(f);

			assert((a = archive_read_new()) != NULL);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_filter_all(a));
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_support_format_all(a));

			if (0 == archive_read_open_memory(a, image, size)) {
				while(0 == archive_read_next_header(a, &ae)) {
					while (0 == archive_read_data_block(a,
						&blk, &blk_size, &blk_offset))
						continue;
				}
				archive_read_close(a);
			}
			archive_read_free(a);
		}
		free(image);
		free(rawimage);
	}
}